

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

JsonArrayWriter * __thiscall
Catch::JsonArrayWriter::writeImpl<bool>(JsonArrayWriter *this,bool *value)

{
  size_t in_RCX;
  void *__buf;
  byte *in_RSI;
  JsonArrayWriter *in_RDI;
  ostream *in_stack_fffffffffffffe40;
  JsonValueWriter *this_00;
  JsonValueWriter local_1a8;
  byte *local_10;
  
  local_10 = in_RSI;
  JsonUtils::appendCommaNewline(in_stack_fffffffffffffe40,(bool *)in_RDI,0x1d01a9);
  this_00 = &local_1a8;
  JsonValueWriter::JsonValueWriter(this_00,(ostream *)in_RDI);
  JsonValueWriter::write(this_00,*local_10 & 1,__buf,in_RCX);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1d01e3);
  return in_RDI;
}

Assistant:

JsonArrayWriter& writeImpl( T const& value ) {
            JsonUtils::appendCommaNewline(
                m_os, m_should_comma, m_indent_level + 1 );
            JsonValueWriter{ m_os }.write( value );

            return *this;
        }